

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O1

void embree::sse42::BVHNIntersector1<4,_257,_true,_embree::sse42::VirtualCurveIntersector1>::
     intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  float *pfVar1;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar2;
  int iVar3;
  ulong uVar4;
  undefined8 uVar5;
  long lVar6;
  undefined1 auVar7 [16];
  bool bVar8;
  undefined1 (*pauVar9) [16];
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  undefined1 (*pauVar17) [16];
  undefined4 uVar18;
  ulong unaff_R15;
  int iVar19;
  float fVar20;
  float fVar21;
  float fVar39;
  float fVar40;
  vint4 bi_1;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  float fVar41;
  float fVar46;
  float fVar47;
  vint4 ai;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  float fVar48;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  float fVar49;
  float fVar54;
  float fVar55;
  vfloat4 a0;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  float fVar56;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  float fVar57;
  float fVar62;
  float fVar63;
  vint4 ai_1;
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  float fVar64;
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  float fVar68;
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  float fVar69;
  float fVar76;
  float fVar77;
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  float fVar80;
  float fVar81;
  float fVar84;
  float fVar86;
  vint4 bi_3;
  float fVar88;
  undefined1 auVar82 [16];
  float fVar85;
  float fVar87;
  float fVar89;
  undefined1 auVar83 [16];
  float fVar90;
  float fVar91;
  float fVar94;
  float fVar96;
  vint4 bi;
  float fVar98;
  undefined1 auVar92 [16];
  float fVar95;
  float fVar97;
  float fVar99;
  undefined1 auVar93 [16];
  undefined1 auVar100 [16];
  uint uVar101;
  uint uVar102;
  uint uVar103;
  uint uVar104;
  float fVar105;
  float fVar106;
  float fVar107;
  float fVar108;
  vfloat<4> tNear;
  Precalculations pre;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  undefined1 local_10c8 [8];
  float fStack_10c0;
  float fStack_10bc;
  float local_10b8;
  float fStack_10b4;
  float fStack_10b0;
  float fStack_10ac;
  float local_10a8;
  float fStack_10a4;
  float fStack_10a0;
  float fStack_109c;
  ulong local_1090;
  Intersectors *local_1088;
  RayQueryContext *local_1080;
  float local_1078;
  float fStack_1074;
  float fStack_1070;
  float fStack_106c;
  float local_1068;
  float fStack_1064;
  float fStack_1060;
  float fStack_105c;
  float local_1058;
  float fStack_1054;
  float fStack_1050;
  float fStack_104c;
  float local_1048;
  float fStack_1044;
  float fStack_1040;
  float fStack_103c;
  float local_1038;
  float fStack_1034;
  float fStack_1030;
  float fStack_102c;
  float local_1028;
  float fStack_1024;
  float fStack_1020;
  float fStack_101c;
  undefined1 local_1018 [16];
  float local_1008;
  float fStack_1004;
  float fStack_1000;
  float fStack_ffc;
  float local_ff8;
  float fStack_ff4;
  float fStack_ff0;
  float fStack_fec;
  float local_fe8;
  float fStack_fe4;
  float fStack_fe0;
  float fStack_fdc;
  float local_fd8;
  float fStack_fd4;
  float fStack_fd0;
  float fStack_fcc;
  float local_fc8;
  float fStack_fc4;
  float fStack_fc0;
  float fStack_fbc;
  float local_fb8 [4];
  undefined1 local_fa8 [16];
  undefined1 local_f98 [16];
  undefined1 local_f88 [16];
  long local_f78;
  undefined4 uStack_f70;
  undefined1 local_f68 [3896];
  
  local_1080 = context;
  local_1088 = This;
  if (*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 != 8) {
    aVar2 = (ray->super_RayK<1>).dir.field_0.field_1;
    local_fe8 = aVar2.x;
    local_ff8 = aVar2.y;
    local_fd8 = aVar2.z;
    auVar22 = dpps((undefined1  [16])aVar2,(undefined1  [16])aVar2,0x7f);
    auVar50 = rsqrtss(auVar22,auVar22);
    fVar20 = auVar50._0_4_;
    local_fb8[0] = fVar20 * 1.5 - fVar20 * fVar20 * auVar22._0_4_ * 0.5 * fVar20;
    auVar67._0_4_ = local_fe8 * local_fb8[0];
    auVar67._4_4_ = local_ff8 * local_fb8[0];
    auVar67._8_4_ = local_fd8 * local_fb8[0];
    auVar67._12_4_ = aVar2.field_3.w * local_fb8[0];
    uVar13 = CONCAT44(auVar67._4_4_,auVar67._4_4_);
    auVar23._0_8_ = uVar13 ^ 0x8000000080000000;
    auVar23._8_4_ = -auVar67._12_4_;
    auVar23._12_4_ = -auVar67._12_4_;
    auVar75._0_12_ = ZEXT812(0);
    auVar75._12_4_ = 0;
    auVar23 = blendps(auVar23,auVar75,0xe);
    auVar22._4_4_ = auVar23._0_4_;
    auVar22._0_4_ = auVar67._8_4_;
    auVar22._8_4_ = auVar23._4_4_;
    auVar22._12_4_ = 0;
    auVar50._4_4_ = auVar23._0_4_;
    auVar50._0_4_ = auVar67._8_4_;
    auVar50._8_4_ = auVar23._4_4_;
    auVar50._12_4_ = 0;
    auVar79 = dpps(auVar50 << 0x20,auVar22 << 0x20,0x7f);
    uVar13 = CONCAT44(auVar67._12_4_,auVar67._8_4_);
    auVar70._0_8_ = uVar13 ^ 0x8000000080000000;
    auVar70._8_4_ = -auVar67._8_4_;
    auVar70._12_4_ = -auVar67._12_4_;
    auVar23 = insertps(auVar70,auVar67,0x2a);
    auVar50 = dpps(auVar23,auVar23,0x7f);
    iVar19 = -(uint)(auVar50._0_4_ < auVar79._0_4_);
    auVar79._4_4_ = iVar19;
    auVar79._0_4_ = iVar19;
    auVar79._8_4_ = iVar19;
    auVar79._12_4_ = iVar19;
    auVar22 = blendvps(auVar23,auVar22 << 0x20,auVar79);
    auVar50 = dpps(auVar22,auVar22,0x7f);
    auVar23 = rsqrtss(auVar50,auVar50);
    fVar20 = auVar23._0_4_;
    fVar20 = fVar20 * 1.5 - fVar20 * fVar20 * auVar50._0_4_ * 0.5 * fVar20;
    fVar21 = fVar20 * auVar22._0_4_;
    fVar39 = fVar20 * auVar22._4_4_;
    fVar40 = fVar20 * auVar22._8_4_;
    fVar20 = fVar20 * auVar22._12_4_;
    fVar69 = fVar39 * auVar67._0_4_ - auVar67._4_4_ * fVar21;
    fVar76 = fVar40 * auVar67._4_4_ - auVar67._8_4_ * fVar39;
    fVar77 = fVar21 * auVar67._8_4_ - auVar67._0_4_ * fVar40;
    auVar71._12_4_ = fVar20 * auVar67._12_4_ - auVar67._12_4_ * fVar20;
    auVar71._0_8_ = CONCAT44(fVar77,fVar76);
    auVar71._8_4_ = fVar69;
    auVar78._8_4_ = fVar69;
    auVar78._0_8_ = auVar71._0_8_;
    auVar78._12_4_ = auVar71._12_4_;
    auVar22 = dpps(auVar78,auVar71,0x7f);
    auVar50 = rsqrtss(auVar22,auVar22);
    fVar20 = auVar50._0_4_;
    fVar20 = fVar20 * 1.5 - fVar20 * fVar20 * auVar22._0_4_ * 0.5 * fVar20;
    local_f88._4_4_ = fVar20 * fVar69;
    local_f88._0_4_ = fVar40;
    local_f88._8_4_ = auVar67._8_4_ * local_fb8[0];
    local_f88._12_4_ = 0;
    local_f98._4_4_ = fVar20 * fVar77;
    local_f98._0_4_ = fVar39;
    local_f98._8_4_ = auVar67._4_4_ * local_fb8[0];
    local_f98._12_4_ = 0;
    local_fa8._4_4_ = fVar20 * fVar76;
    local_fa8._0_4_ = fVar21;
    local_fa8._8_4_ = auVar67._0_4_ * local_fb8[0];
    local_fa8._12_4_ = 0;
    local_f78 = *(long *)&This->ptr[1].bounds.bounds0.lower.field_0;
    uStack_f70 = 0;
    if (local_f78 != 8) {
      pauVar17 = (undefined1 (*) [16])local_f68;
      local_1048 = (ray->super_RayK<1>).org.field_0.m128[0];
      local_1058 = (ray->super_RayK<1>).org.field_0.m128[1];
      local_fc8 = (ray->super_RayK<1>).org.field_0.m128[2];
      fVar20 = *(float *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
      fVar21 = 0.0;
      if (0.0 <= fVar20) {
        fVar21 = fVar20;
      }
      auVar24._4_4_ = -(uint)(ABS(local_ff8) < 1e-18);
      auVar24._0_4_ = -(uint)(ABS(local_fe8) < 1e-18);
      auVar24._8_4_ = -(uint)(ABS(local_fd8) < 1e-18);
      auVar24._12_4_ = -(uint)(ABS(aVar2.field_3.w) < 1e-18);
      auVar22 = divps(_DAT_01feca10,(undefined1  [16])aVar2);
      auVar22 = blendvps(auVar22,_DAT_0201c930,auVar24);
      fVar20 = (ray->super_RayK<1>).tfar;
      fVar39 = 0.0;
      if (0.0 <= fVar20) {
        fVar39 = fVar20;
      }
      local_1068 = auVar22._0_4_ * 0.99999964;
      local_1078 = auVar22._4_4_ * 0.99999964;
      local_1038 = auVar22._8_4_ * 0.99999964;
      local_10a8 = auVar22._0_4_ * 1.0000004;
      local_10b8 = auVar22._4_4_ * 1.0000004;
      local_1028 = auVar22._8_4_ * 1.0000004;
      fStack_fe4 = local_fe8;
      fStack_fe0 = local_fe8;
      fStack_fdc = local_fe8;
      fStack_ff4 = local_ff8;
      fStack_ff0 = local_ff8;
      fStack_fec = local_ff8;
      fStack_fd4 = local_fd8;
      fStack_fd0 = local_fd8;
      fStack_fcc = local_fd8;
      uVar16 = (ulong)(local_1068 < 0.0) * 0x10;
      uVar12 = (ulong)(local_1078 < 0.0) << 4 | 0x20;
      uVar14 = (ulong)(local_1038 < 0.0) << 4 | 0x40;
      local_1018._4_4_ = fVar21;
      local_1018._0_4_ = fVar21;
      local_1018._8_4_ = fVar21;
      local_1018._12_4_ = fVar21;
      fStack_1044 = local_1048;
      fStack_1040 = local_1048;
      fStack_103c = local_1048;
      fStack_1054 = local_1058;
      fStack_1050 = local_1058;
      fStack_104c = local_1058;
      fStack_fc4 = local_fc8;
      fStack_fc0 = local_fc8;
      fStack_fbc = local_fc8;
      fStack_1024 = local_1028;
      fStack_1020 = local_1028;
      fStack_101c = local_1028;
      fStack_1034 = local_1038;
      fStack_1030 = local_1038;
      fStack_102c = local_1038;
      fStack_1064 = local_1068;
      fStack_1060 = local_1068;
      fStack_105c = local_1068;
      fStack_1074 = local_1078;
      fStack_1070 = local_1078;
      fStack_106c = local_1078;
      fStack_10a4 = local_10a8;
      fStack_10a0 = local_10a8;
      fStack_109c = local_10a8;
      local_1090 = uVar12;
      fStack_10b4 = local_10b8;
      fStack_10b0 = local_10b8;
      fStack_10ac = local_10b8;
      uVar13 = uVar12;
      fVar20 = fVar39;
      fVar21 = fVar39;
      fVar40 = fVar39;
      auVar22 = local_1018;
      fVar69 = local_1068;
      fVar76 = local_1068;
      fVar77 = local_1068;
      fVar68 = local_1068;
      fVar105 = local_fc8;
      fVar106 = local_fc8;
      fVar107 = local_fc8;
      fVar108 = local_fc8;
      fVar41 = local_1048;
      fVar46 = local_1048;
      fVar47 = local_1048;
      fVar48 = local_1048;
      fVar49 = local_1058;
      fVar54 = local_1058;
      fVar55 = local_1058;
      fVar56 = local_1058;
      fVar57 = local_10a8;
      fVar62 = local_10a8;
      fVar63 = local_10a8;
      fVar64 = local_10a8;
      fVar81 = local_10b8;
      fVar85 = local_10b8;
      fVar87 = local_10b8;
      fVar89 = local_10b8;
      fVar91 = local_1028;
      fVar95 = local_1028;
      fVar97 = local_1028;
      fVar99 = local_1028;
      fVar80 = local_1038;
      fVar84 = local_1038;
      fVar86 = local_1038;
      fVar88 = local_1038;
      fVar90 = local_1078;
      fVar94 = local_1078;
      fVar96 = local_1078;
      fVar98 = local_1078;
      do {
        do {
          if (pauVar17 == (undefined1 (*) [16])&local_f78) {
            return;
          }
          pauVar9 = pauVar17 + -1;
          pauVar17 = pauVar17 + -1;
        } while ((ray->super_RayK<1>).tfar < *(float *)((long)*pauVar9 + 8));
        uVar11 = *(ulong *)*pauVar17;
        do {
          if ((uVar11 & 0xf) == 0) {
            pfVar1 = (float *)(uVar11 + 0x20 + uVar16);
            auVar25._0_4_ = (*pfVar1 - fVar41) * fVar69;
            auVar25._4_4_ = (pfVar1[1] - fVar46) * fVar76;
            auVar25._8_4_ = (pfVar1[2] - fVar47) * fVar77;
            auVar25._12_4_ = (pfVar1[3] - fVar48) * fVar68;
            pfVar1 = (float *)(uVar11 + 0x20 + uVar13);
            auVar42._0_4_ = (*pfVar1 - fVar49) * fVar90;
            auVar42._4_4_ = (pfVar1[1] - fVar54) * fVar94;
            auVar42._8_4_ = (pfVar1[2] - fVar55) * fVar96;
            auVar42._12_4_ = (pfVar1[3] - fVar56) * fVar98;
            auVar50 = maxps(auVar25,auVar42);
            pfVar1 = (float *)(uVar11 + 0x20 + uVar14);
            auVar43._0_4_ = (*pfVar1 - fVar105) * fVar80;
            auVar43._4_4_ = (pfVar1[1] - fVar106) * fVar84;
            auVar43._8_4_ = (pfVar1[2] - fVar107) * fVar86;
            auVar43._12_4_ = (pfVar1[3] - fVar108) * fVar88;
            pfVar1 = (float *)(uVar11 + 0x20 + (uVar16 ^ 0x10));
            auVar51._0_4_ = (*pfVar1 - fVar41) * fVar57;
            auVar51._4_4_ = (pfVar1[1] - fVar46) * fVar62;
            auVar51._8_4_ = (pfVar1[2] - fVar47) * fVar63;
            auVar51._12_4_ = (pfVar1[3] - fVar48) * fVar64;
            pfVar1 = (float *)(uVar11 + 0x20 + (uVar12 ^ 0x10));
            auVar58._0_4_ = (*pfVar1 - fVar49) * fVar81;
            auVar58._4_4_ = (pfVar1[1] - fVar54) * fVar85;
            auVar58._8_4_ = (pfVar1[2] - fVar55) * fVar87;
            auVar58._12_4_ = (pfVar1[3] - fVar56) * fVar89;
            auVar79 = minps(auVar51,auVar58);
            pfVar1 = (float *)(uVar11 + 0x20 + (uVar14 ^ 0x10));
            auVar59._0_4_ = (*pfVar1 - fVar105) * fVar91;
            auVar59._4_4_ = (pfVar1[1] - fVar106) * fVar95;
            auVar59._8_4_ = (pfVar1[2] - fVar107) * fVar97;
            auVar59._12_4_ = (pfVar1[3] - fVar108) * fVar99;
            auVar23 = maxps(auVar43,auVar22);
            _local_10c8 = maxps(auVar50,auVar23);
            auVar7._4_4_ = fVar20;
            auVar7._0_4_ = fVar39;
            auVar7._8_4_ = fVar21;
            auVar7._12_4_ = fVar40;
            auVar50 = minps(auVar59,auVar7);
            auVar50 = minps(auVar79,auVar50);
            auVar26._4_4_ = -(uint)(local_10c8._4_4_ <= auVar50._4_4_);
            auVar26._0_4_ = -(uint)(local_10c8._0_4_ <= auVar50._0_4_);
            auVar26._8_4_ = -(uint)(local_10c8._8_4_ <= auVar50._8_4_);
            auVar26._12_4_ = -(uint)(local_10c8._12_4_ <= auVar50._12_4_);
            uVar18 = movmskps((int)unaff_R15,auVar26);
LAB_00e70313:
            unaff_R15 = CONCAT44((int)(unaff_R15 >> 0x20),uVar18);
            bVar8 = true;
          }
          else {
            if ((int)(uVar11 & 0xf) == 2) {
              uVar10 = uVar11 & 0xfffffffffffffff0;
              local_1008 = *(float *)(uVar10 + 0x70);
              fStack_1004 = *(float *)(uVar10 + 0x74);
              fStack_1000 = *(float *)(uVar10 + 0x78);
              fStack_ffc = *(float *)(uVar10 + 0x7c);
              auVar82._0_4_ =
                   local_fe8 * *(float *)(uVar10 + 0x20) +
                   local_ff8 * *(float *)(uVar10 + 0x50) + local_fd8 * *(float *)(uVar10 + 0x80);
              auVar82._4_4_ =
                   fStack_fe4 * *(float *)(uVar10 + 0x24) +
                   fStack_ff4 * *(float *)(uVar10 + 0x54) + fStack_fd4 * *(float *)(uVar10 + 0x84);
              auVar82._8_4_ =
                   fStack_fe0 * *(float *)(uVar10 + 0x28) +
                   fStack_ff0 * *(float *)(uVar10 + 0x58) + fStack_fd0 * *(float *)(uVar10 + 0x88);
              auVar82._12_4_ =
                   fStack_fdc * *(float *)(uVar10 + 0x2c) +
                   fStack_fec * *(float *)(uVar10 + 0x5c) + fStack_fcc * *(float *)(uVar10 + 0x8c);
              auVar92._0_4_ =
                   local_fe8 * *(float *)(uVar10 + 0x30) +
                   local_ff8 * *(float *)(uVar10 + 0x60) + local_fd8 * *(float *)(uVar10 + 0x90);
              auVar92._4_4_ =
                   fStack_fe4 * *(float *)(uVar10 + 0x34) +
                   fStack_ff4 * *(float *)(uVar10 + 100) + fStack_fd4 * *(float *)(uVar10 + 0x94);
              auVar92._8_4_ =
                   fStack_fe0 * *(float *)(uVar10 + 0x38) +
                   fStack_ff0 * *(float *)(uVar10 + 0x68) + fStack_fd0 * *(float *)(uVar10 + 0x98);
              auVar92._12_4_ =
                   fStack_fdc * *(float *)(uVar10 + 0x3c) +
                   fStack_fec * *(float *)(uVar10 + 0x6c) + fStack_fcc * *(float *)(uVar10 + 0x9c);
              auVar100._0_4_ =
                   local_fe8 * *(float *)(uVar10 + 0x40) +
                   local_ff8 * local_1008 + local_fd8 * *(float *)(uVar10 + 0xa0);
              auVar100._4_4_ =
                   fStack_fe4 * *(float *)(uVar10 + 0x44) +
                   fStack_ff4 * fStack_1004 + fStack_fd4 * *(float *)(uVar10 + 0xa4);
              auVar100._8_4_ =
                   fStack_fe0 * *(float *)(uVar10 + 0x48) +
                   fStack_ff0 * fStack_1000 + fStack_fd0 * *(float *)(uVar10 + 0xa8);
              auVar100._12_4_ =
                   fStack_fdc * *(float *)(uVar10 + 0x4c) +
                   fStack_fec * fStack_ffc + fStack_fcc * *(float *)(uVar10 + 0xac);
              uVar101 = (uint)DAT_01fec6c0;
              uVar102 = DAT_01fec6c0._4_4_;
              uVar103 = DAT_01fec6c0._8_4_;
              uVar104 = DAT_01fec6c0._12_4_;
              fVar69 = (float)DAT_01ff1d40;
              fVar76 = DAT_01ff1d40._4_4_;
              fVar77 = DAT_01ff1d40._8_4_;
              fVar68 = DAT_01ff1d40._12_4_;
              auVar27._4_4_ = -(uint)((float)((uint)auVar82._4_4_ & uVar102) < fVar76);
              auVar27._0_4_ = -(uint)((float)((uint)auVar82._0_4_ & uVar101) < fVar69);
              auVar27._8_4_ = -(uint)((float)((uint)auVar82._8_4_ & uVar103) < fVar77);
              auVar27._12_4_ = -(uint)((float)((uint)auVar82._12_4_ & uVar104) < fVar68);
              auVar22 = blendvps(auVar82,_DAT_01ff1d40,auVar27);
              auVar28._4_4_ = -(uint)((float)((uint)auVar92._4_4_ & uVar102) < fVar76);
              auVar28._0_4_ = -(uint)((float)((uint)auVar92._0_4_ & uVar101) < fVar69);
              auVar28._8_4_ = -(uint)((float)((uint)auVar92._8_4_ & uVar103) < fVar77);
              auVar28._12_4_ = -(uint)((float)((uint)auVar92._12_4_ & uVar104) < fVar68);
              auVar50 = blendvps(auVar92,_DAT_01ff1d40,auVar28);
              auVar29._4_4_ = -(uint)((float)((uint)auVar100._4_4_ & uVar102) < fVar76);
              auVar29._0_4_ = -(uint)((float)((uint)auVar100._0_4_ & uVar101) < fVar69);
              auVar29._8_4_ = -(uint)((float)((uint)auVar100._8_4_ & uVar103) < fVar77);
              auVar29._12_4_ = -(uint)((float)((uint)auVar100._12_4_ & uVar104) < fVar68);
              auVar23 = blendvps(auVar100,_DAT_01ff1d40,auVar29);
              auVar79 = rcpps(_DAT_01fec6c0,auVar22);
              fVar69 = auVar79._0_4_;
              fVar76 = auVar79._4_4_;
              fVar77 = auVar79._8_4_;
              fVar68 = auVar79._12_4_;
              fVar69 = (1.0 - auVar22._0_4_ * fVar69) * fVar69 + fVar69;
              fVar76 = (1.0 - auVar22._4_4_ * fVar76) * fVar76 + fVar76;
              fVar77 = (1.0 - auVar22._8_4_ * fVar77) * fVar77 + fVar77;
              fVar68 = (1.0 - auVar22._12_4_ * fVar68) * fVar68 + fVar68;
              auVar22 = rcpps(auVar79,auVar50);
              fVar81 = auVar22._0_4_;
              fVar85 = auVar22._4_4_;
              fVar87 = auVar22._8_4_;
              fVar89 = auVar22._12_4_;
              fVar81 = (1.0 - auVar50._0_4_ * fVar81) * fVar81 + fVar81;
              fVar85 = (1.0 - auVar50._4_4_ * fVar85) * fVar85 + fVar85;
              fVar87 = (1.0 - auVar50._8_4_ * fVar87) * fVar87 + fVar87;
              fVar89 = (1.0 - auVar50._12_4_ * fVar89) * fVar89 + fVar89;
              auVar22 = rcpps(auVar22,auVar23);
              fVar91 = auVar22._0_4_;
              fVar95 = auVar22._4_4_;
              fVar97 = auVar22._8_4_;
              fVar99 = auVar22._12_4_;
              fVar91 = (1.0 - auVar23._0_4_ * fVar91) * fVar91 + fVar91;
              fVar95 = (1.0 - auVar23._4_4_ * fVar95) * fVar95 + fVar95;
              fVar97 = (1.0 - auVar23._8_4_ * fVar97) * fVar97 + fVar97;
              fVar99 = (1.0 - auVar23._12_4_ * fVar99) * fVar99 + fVar99;
              fVar57 = (*(float *)(uVar10 + 0x20) * local_1048 +
                       *(float *)(uVar10 + 0x50) * local_1058 +
                       *(float *)(uVar10 + 0x80) * fVar105 + *(float *)(uVar10 + 0xb0)) * -fVar69;
              fVar62 = (*(float *)(uVar10 + 0x24) * fStack_1044 +
                       *(float *)(uVar10 + 0x54) * fStack_1054 +
                       *(float *)(uVar10 + 0x84) * fVar106 + *(float *)(uVar10 + 0xb4)) * -fVar76;
              fVar63 = (*(float *)(uVar10 + 0x28) * fStack_1040 +
                       *(float *)(uVar10 + 0x58) * fStack_1050 +
                       *(float *)(uVar10 + 0x88) * fVar107 + *(float *)(uVar10 + 0xb8)) * -fVar77;
              fVar64 = (*(float *)(uVar10 + 0x2c) * fStack_103c +
                       *(float *)(uVar10 + 0x5c) * fStack_104c +
                       *(float *)(uVar10 + 0x8c) * fVar108 + *(float *)(uVar10 + 0xbc)) * -fVar68;
              fVar49 = (*(float *)(uVar10 + 0x30) * local_1048 +
                       *(float *)(uVar10 + 0x60) * local_1058 +
                       *(float *)(uVar10 + 0x90) * fVar105 + *(float *)(uVar10 + 0xc0)) * -fVar81;
              fVar54 = (*(float *)(uVar10 + 0x34) * fStack_1044 +
                       *(float *)(uVar10 + 100) * fStack_1054 +
                       *(float *)(uVar10 + 0x94) * fVar106 + *(float *)(uVar10 + 0xc4)) * -fVar85;
              fVar55 = (*(float *)(uVar10 + 0x38) * fStack_1040 +
                       *(float *)(uVar10 + 0x68) * fStack_1050 +
                       *(float *)(uVar10 + 0x98) * fVar107 + *(float *)(uVar10 + 200)) * -fVar87;
              fVar56 = (*(float *)(uVar10 + 0x3c) * fStack_103c +
                       *(float *)(uVar10 + 0x6c) * fStack_104c +
                       *(float *)(uVar10 + 0x9c) * fVar108 + *(float *)(uVar10 + 0xcc)) * -fVar89;
              fVar41 = (*(float *)(uVar10 + 0x40) * local_1048 +
                       local_1008 * local_1058 +
                       *(float *)(uVar10 + 0xa0) * fVar105 + *(float *)(uVar10 + 0xd0)) * -fVar91;
              fVar46 = (*(float *)(uVar10 + 0x44) * fStack_1044 +
                       fStack_1004 * fStack_1054 +
                       *(float *)(uVar10 + 0xa4) * fVar106 + *(float *)(uVar10 + 0xd4)) * -fVar95;
              fVar47 = (*(float *)(uVar10 + 0x48) * fStack_1040 +
                       fStack_1000 * fStack_1050 +
                       *(float *)(uVar10 + 0xa8) * fVar107 + *(float *)(uVar10 + 0xd8)) * -fVar97;
              fVar48 = (*(float *)(uVar10 + 0x4c) * fStack_103c +
                       fStack_ffc * fStack_104c +
                       *(float *)(uVar10 + 0xac) * fVar108 + *(float *)(uVar10 + 0xdc)) * -fVar99;
              fVar69 = fVar69 + fVar57;
              fVar76 = fVar76 + fVar62;
              fVar77 = fVar77 + fVar63;
              fVar68 = fVar68 + fVar64;
              fVar81 = fVar81 + fVar49;
              fVar85 = fVar85 + fVar54;
              fVar87 = fVar87 + fVar55;
              fVar89 = fVar89 + fVar56;
              fVar91 = fVar91 + fVar41;
              fVar95 = fVar95 + fVar46;
              fVar97 = fVar97 + fVar47;
              fVar99 = fVar99 + fVar48;
              auVar65._0_4_ =
                   (uint)((int)fVar81 < (int)fVar49) * (int)fVar81 |
                   (uint)((int)fVar81 >= (int)fVar49) * (int)fVar49;
              auVar65._4_4_ =
                   (uint)((int)fVar85 < (int)fVar54) * (int)fVar85 |
                   (uint)((int)fVar85 >= (int)fVar54) * (int)fVar54;
              auVar65._8_4_ =
                   (uint)((int)fVar87 < (int)fVar55) * (int)fVar87 |
                   (uint)((int)fVar87 >= (int)fVar55) * (int)fVar55;
              auVar65._12_4_ =
                   (uint)((int)fVar89 < (int)fVar56) * (int)fVar89 |
                   (uint)((int)fVar89 >= (int)fVar56) * (int)fVar56;
              auVar72._0_4_ =
                   (uint)((int)fVar91 < (int)fVar41) * (int)fVar91 |
                   (uint)((int)fVar91 >= (int)fVar41) * (int)fVar41;
              auVar72._4_4_ =
                   (uint)((int)fVar95 < (int)fVar46) * (int)fVar95 |
                   (uint)((int)fVar95 >= (int)fVar46) * (int)fVar46;
              auVar72._8_4_ =
                   (uint)((int)fVar97 < (int)fVar47) * (int)fVar97 |
                   (uint)((int)fVar97 >= (int)fVar47) * (int)fVar47;
              auVar72._12_4_ =
                   (uint)((int)fVar99 < (int)fVar48) * (int)fVar99 |
                   (uint)((int)fVar99 >= (int)fVar48) * (int)fVar48;
              auVar50 = maxps(auVar65,auVar72);
              auVar73._0_4_ =
                   (uint)((int)fVar69 < (int)fVar57) * (int)fVar69 |
                   (uint)((int)fVar69 >= (int)fVar57) * (int)fVar57;
              auVar73._4_4_ =
                   (uint)((int)fVar76 < (int)fVar62) * (int)fVar76 |
                   (uint)((int)fVar76 >= (int)fVar62) * (int)fVar62;
              auVar73._8_4_ =
                   (uint)((int)fVar77 < (int)fVar63) * (int)fVar77 |
                   (uint)((int)fVar77 >= (int)fVar63) * (int)fVar63;
              auVar73._12_4_ =
                   (uint)((int)fVar68 < (int)fVar64) * (int)fVar68 |
                   (uint)((int)fVar68 >= (int)fVar64) * (int)fVar64;
              auVar30._0_4_ =
                   (uint)((int)fVar69 < (int)fVar57) * (int)fVar57 |
                   (uint)((int)fVar69 >= (int)fVar57) * (int)fVar69;
              auVar30._4_4_ =
                   (uint)((int)fVar76 < (int)fVar62) * (int)fVar62 |
                   (uint)((int)fVar76 >= (int)fVar62) * (int)fVar76;
              auVar30._8_4_ =
                   (uint)((int)fVar77 < (int)fVar63) * (int)fVar63 |
                   (uint)((int)fVar77 >= (int)fVar63) * (int)fVar77;
              auVar30._12_4_ =
                   (uint)((int)fVar68 < (int)fVar64) * (int)fVar64 |
                   (uint)((int)fVar68 >= (int)fVar64) * (int)fVar68;
              auVar83._0_4_ =
                   (uint)((int)fVar81 < (int)fVar49) * (int)fVar49 |
                   (uint)((int)fVar81 >= (int)fVar49) * (int)fVar81;
              auVar83._4_4_ =
                   (uint)((int)fVar85 < (int)fVar54) * (int)fVar54 |
                   (uint)((int)fVar85 >= (int)fVar54) * (int)fVar85;
              auVar83._8_4_ =
                   (uint)((int)fVar87 < (int)fVar55) * (int)fVar55 |
                   (uint)((int)fVar87 >= (int)fVar55) * (int)fVar87;
              auVar83._12_4_ =
                   (uint)((int)fVar89 < (int)fVar56) * (int)fVar56 |
                   (uint)((int)fVar89 >= (int)fVar56) * (int)fVar89;
              auVar93._0_4_ =
                   (uint)((int)fVar91 < (int)fVar41) * (int)fVar41 |
                   (uint)((int)fVar91 >= (int)fVar41) * (int)fVar91;
              auVar93._4_4_ =
                   (uint)((int)fVar95 < (int)fVar46) * (int)fVar46 |
                   (uint)((int)fVar95 >= (int)fVar46) * (int)fVar95;
              auVar93._8_4_ =
                   (uint)((int)fVar97 < (int)fVar47) * (int)fVar47 |
                   (uint)((int)fVar97 >= (int)fVar47) * (int)fVar97;
              auVar93._12_4_ =
                   (uint)((int)fVar99 < (int)fVar48) * (int)fVar48 |
                   (uint)((int)fVar99 >= (int)fVar48) * (int)fVar99;
              auVar23 = minps(auVar83,auVar93);
              auVar22 = maxps(local_1018,auVar73);
              auVar22 = maxps(auVar22,auVar50);
              auVar52._4_4_ = fVar20;
              auVar52._0_4_ = fVar39;
              auVar52._8_4_ = fVar21;
              auVar52._12_4_ = fVar40;
              auVar50 = minps(auVar52,auVar30);
              auVar50 = minps(auVar50,auVar23);
              local_10c8._0_4_ = auVar22._0_4_ * 0.99999964;
              local_10c8._4_4_ = auVar22._4_4_ * 0.99999964;
              fStack_10c0 = auVar22._8_4_ * 0.99999964;
              fStack_10bc = auVar22._12_4_ * 0.99999964;
              auVar44._4_4_ = -(uint)((float)local_10c8._4_4_ <= auVar50._4_4_ * 1.0000004);
              auVar44._0_4_ = -(uint)((float)local_10c8._0_4_ <= auVar50._0_4_ * 1.0000004);
              auVar44._8_4_ = -(uint)(fStack_10c0 <= auVar50._8_4_ * 1.0000004);
              auVar44._12_4_ = -(uint)(fStack_10bc <= auVar50._12_4_ * 1.0000004);
              uVar18 = movmskps((int)unaff_R15,auVar44);
              auVar22 = local_1018;
              fVar69 = local_1068;
              fVar76 = fStack_1064;
              fVar77 = fStack_1060;
              fVar68 = fStack_105c;
              fVar41 = local_1048;
              fVar46 = fStack_1044;
              fVar47 = fStack_1040;
              fVar48 = fStack_103c;
              fVar49 = local_1058;
              fVar54 = fStack_1054;
              fVar55 = fStack_1050;
              fVar56 = fStack_104c;
              fVar57 = local_10a8;
              fVar62 = fStack_10a4;
              fVar63 = fStack_10a0;
              fVar64 = fStack_109c;
              fVar81 = local_10b8;
              fVar85 = fStack_10b4;
              fVar87 = fStack_10b0;
              fVar89 = fStack_10ac;
              fVar91 = local_1028;
              fVar95 = fStack_1024;
              fVar97 = fStack_1020;
              fVar99 = fStack_101c;
              fVar80 = local_1038;
              fVar84 = fStack_1034;
              fVar86 = fStack_1030;
              fVar88 = fStack_102c;
              fVar90 = local_1078;
              fVar94 = fStack_1074;
              fVar96 = fStack_1070;
              fVar98 = fStack_106c;
              goto LAB_00e70313;
            }
            bVar8 = false;
          }
          if (bVar8) {
            if (unaff_R15 == 0) {
              iVar19 = 4;
            }
            else {
              uVar10 = uVar11 & 0xfffffffffffffff0;
              lVar6 = 0;
              if (unaff_R15 != 0) {
                for (; (unaff_R15 >> lVar6 & 1) == 0; lVar6 = lVar6 + 1) {
                }
              }
              iVar19 = 0;
              uVar11 = *(ulong *)(uVar10 + lVar6 * 8);
              uVar15 = unaff_R15 - 1 & unaff_R15;
              if (uVar15 != 0) {
                uVar101 = *(uint *)(local_10c8 + lVar6 * 4);
                lVar6 = 0;
                if (uVar15 != 0) {
                  for (; (uVar15 >> lVar6 & 1) == 0; lVar6 = lVar6 + 1) {
                  }
                }
                uVar4 = *(ulong *)(uVar10 + lVar6 * 8);
                uVar102 = *(uint *)(local_10c8 + lVar6 * 4);
                uVar15 = uVar15 - 1 & uVar15;
                if (uVar15 == 0) {
                  if (uVar101 < uVar102) {
                    *(ulong *)*pauVar17 = uVar4;
                    *(uint *)((long)*pauVar17 + 8) = uVar102;
                    pauVar17 = pauVar17 + 1;
                  }
                  else {
                    *(ulong *)*pauVar17 = uVar11;
                    *(uint *)((long)*pauVar17 + 8) = uVar101;
                    uVar11 = uVar4;
                    pauVar17 = pauVar17 + 1;
                  }
                }
                else {
                  auVar45._8_4_ = uVar101;
                  auVar45._0_8_ = uVar11;
                  auVar45._12_4_ = 0;
                  auVar60._8_4_ = uVar102;
                  auVar60._0_8_ = uVar4;
                  auVar60._12_4_ = 0;
                  lVar6 = 0;
                  if (uVar15 != 0) {
                    for (; (uVar15 >> lVar6 & 1) == 0; lVar6 = lVar6 + 1) {
                    }
                  }
                  uVar5 = *(undefined8 *)(uVar10 + lVar6 * 8);
                  iVar3 = *(int *)(local_10c8 + lVar6 * 4);
                  auVar53._8_4_ = iVar3;
                  auVar53._0_8_ = uVar5;
                  auVar53._12_4_ = 0;
                  auVar31._8_4_ = -(uint)((int)uVar101 < (int)uVar102);
                  uVar15 = uVar15 - 1 & uVar15;
                  if (uVar15 == 0) {
                    auVar31._4_4_ = auVar31._8_4_;
                    auVar31._0_4_ = auVar31._8_4_;
                    auVar31._12_4_ = auVar31._8_4_;
                    auVar66._8_4_ = uVar102;
                    auVar66._0_8_ = uVar4;
                    auVar66._12_4_ = 0;
                    auVar23 = blendvps(auVar66,auVar45,auVar31);
                    auVar50 = blendvps(auVar45,auVar60,auVar31);
                    auVar32._8_4_ = -(uint)(auVar23._8_4_ < iVar3);
                    auVar32._4_4_ = auVar32._8_4_;
                    auVar32._0_4_ = auVar32._8_4_;
                    auVar32._12_4_ = auVar32._8_4_;
                    auVar61._8_4_ = iVar3;
                    auVar61._0_8_ = uVar5;
                    auVar61._12_4_ = 0;
                    auVar79 = blendvps(auVar61,auVar23,auVar32);
                    auVar67 = blendvps(auVar23,auVar53,auVar32);
                    auVar33._8_4_ = -(uint)(auVar50._8_4_ < auVar67._8_4_);
                    auVar33._4_4_ = auVar33._8_4_;
                    auVar33._0_4_ = auVar33._8_4_;
                    auVar33._12_4_ = auVar33._8_4_;
                    auVar23 = blendvps(auVar67,auVar50,auVar33);
                    auVar50 = blendvps(auVar50,auVar67,auVar33);
                    *pauVar17 = auVar50;
                    pauVar17[1] = auVar23;
                    uVar11 = auVar79._0_8_;
                    pauVar17 = pauVar17 + 2;
                  }
                  else {
                    lVar6 = 0;
                    if (uVar15 != 0) {
                      for (; (uVar15 >> lVar6 & 1) == 0; lVar6 = lVar6 + 1) {
                      }
                    }
                    auVar34._4_4_ = auVar31._8_4_;
                    auVar34._0_4_ = auVar31._8_4_;
                    auVar34._8_4_ = auVar31._8_4_;
                    auVar34._12_4_ = auVar31._8_4_;
                    auVar67 = blendvps(auVar60,auVar45,auVar34);
                    auVar50 = blendvps(auVar45,auVar60,auVar34);
                    auVar74._8_4_ = *(int *)(local_10c8 + lVar6 * 4);
                    auVar74._0_8_ = *(undefined8 *)(uVar10 + lVar6 * 8);
                    auVar74._12_4_ = 0;
                    auVar35._8_4_ = -(uint)(iVar3 < *(int *)(local_10c8 + lVar6 * 4));
                    auVar35._4_4_ = auVar35._8_4_;
                    auVar35._0_4_ = auVar35._8_4_;
                    auVar35._12_4_ = auVar35._8_4_;
                    auVar79 = blendvps(auVar74,auVar53,auVar35);
                    auVar23 = blendvps(auVar53,auVar74,auVar35);
                    auVar36._8_4_ = -(uint)(auVar50._8_4_ < auVar23._8_4_);
                    auVar36._4_4_ = auVar36._8_4_;
                    auVar36._0_4_ = auVar36._8_4_;
                    auVar36._12_4_ = auVar36._8_4_;
                    auVar75 = blendvps(auVar23,auVar50,auVar36);
                    auVar50 = blendvps(auVar50,auVar23,auVar36);
                    auVar37._8_4_ = -(uint)(auVar67._8_4_ < auVar79._8_4_);
                    auVar37._4_4_ = auVar37._8_4_;
                    auVar37._0_4_ = auVar37._8_4_;
                    auVar37._12_4_ = auVar37._8_4_;
                    auVar23 = blendvps(auVar79,auVar67,auVar37);
                    auVar67 = blendvps(auVar67,auVar79,auVar37);
                    auVar38._8_4_ = -(uint)(auVar67._8_4_ < auVar75._8_4_);
                    auVar38._4_4_ = auVar38._8_4_;
                    auVar38._0_4_ = auVar38._8_4_;
                    auVar38._12_4_ = auVar38._8_4_;
                    auVar79 = blendvps(auVar75,auVar67,auVar38);
                    auVar67 = blendvps(auVar67,auVar75,auVar38);
                    *pauVar17 = auVar50;
                    pauVar17[1] = auVar67;
                    pauVar17[2] = auVar79;
                    uVar11 = auVar23._0_8_;
                    pauVar17 = pauVar17 + 3;
                    fVar57 = local_10a8;
                    fVar62 = fStack_10a4;
                    fVar63 = fStack_10a0;
                    fVar64 = fStack_109c;
                    fVar81 = local_10b8;
                    fVar85 = fStack_10b4;
                    fVar87 = fStack_10b0;
                    fVar89 = fStack_10ac;
                  }
                }
              }
            }
          }
          else {
            iVar19 = 6;
          }
        } while (iVar19 == 0);
        if (iVar19 == 6) {
          (**(code **)((long)local_1088->leafIntersector +
                      (ulong)*(byte *)(uVar11 & 0xfffffffffffffff0) * 0x40))
                    (local_fb8,ray,local_1080);
          fVar39 = (ray->super_RayK<1>).tfar;
          uVar13 = local_1090;
          fVar20 = fVar39;
          fVar21 = fVar39;
          fVar40 = fVar39;
          auVar22 = local_1018;
          fVar69 = local_1068;
          fVar76 = fStack_1064;
          fVar77 = fStack_1060;
          fVar68 = fStack_105c;
          fVar105 = local_fc8;
          fVar106 = fStack_fc4;
          fVar107 = fStack_fc0;
          fVar108 = fStack_fbc;
          fVar41 = local_1048;
          fVar46 = fStack_1044;
          fVar47 = fStack_1040;
          fVar48 = fStack_103c;
          fVar49 = local_1058;
          fVar54 = fStack_1054;
          fVar55 = fStack_1050;
          fVar56 = fStack_104c;
          fVar57 = local_10a8;
          fVar62 = fStack_10a4;
          fVar63 = fStack_10a0;
          fVar64 = fStack_109c;
          fVar81 = local_10b8;
          fVar85 = fStack_10b4;
          fVar87 = fStack_10b0;
          fVar89 = fStack_10ac;
          fVar91 = local_1028;
          fVar95 = fStack_1024;
          fVar97 = fStack_1020;
          fVar99 = fStack_101c;
          fVar80 = local_1038;
          fVar84 = fStack_1034;
          fVar86 = fStack_1030;
          fVar88 = fStack_102c;
          fVar90 = local_1078;
          fVar94 = fStack_1074;
          fVar96 = fStack_1070;
          fVar98 = fStack_106c;
        }
      } while( true );
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }